

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O2

Result __thiscall
tonk::SessionIncoming::handleReliableMessage
          (SessionIncoming *this,uint messageType,uint8_t *messageData,uint messageBytes)

{
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  SessionIncoming *this_00;
  
  this_00 = (SessionIncoming *)CONCAT44(in_register_00000034,messageType);
  if ((uint)messageData == 5) {
    insertUncompressed(this_00,(uint8_t *)(CONCAT44(in_register_0000000c,messageBytes) + -2));
    onCompressed(this,(uint8_t *)this_00,messageBytes);
  }
  else {
    if (((uint)messageData < 0x1e) && (this_00->FirstReliable == (uint8_t *)0x0)) {
      this_00->FirstReliable = (uint8_t *)(CONCAT44(in_register_0000000c,messageBytes) + -2);
    }
    deliverMessage(this,messageType,messageData,messageBytes);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionIncoming::handleReliableMessage(
    unsigned messageType,
    const uint8_t* messageData,
    unsigned messageBytes)
{
    TONK_DEBUG_ASSERT(messageType >= protocol::MessageType_StartOfReliables);
    TONK_DEBUG_ASSERT(messageType != protocol::MessageType_Unordered);

    if (messageType == protocol::MessageType_Compressed)
    {
        TONK_VERBOSE_INCOMING_LOG("Handle compressed message block. messageBytes=", messageBytes);

        insertUncompressed(messageData - protocol::kMessageFrameBytes);

        return onCompressed(messageData, messageBytes);
    }

    // Remember the first reliable message that is not Control or Unordered.
    // These types are not included in the compression history buffer
    if (!FirstReliable && messageType < protocol::MessageType_Control) {
        FirstReliable = messageData - protocol::kMessageFrameBytes;
    }

    TONK_VERBOSE_INCOMING_LOG("Handle reliable messageType=", messageType, ". messageBytes=", messageBytes);

    return deliverMessage(messageType, messageData, messageBytes);
}